

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DOMDocumentImpl::removeRange(DOMDocumentImpl *this,DOMRangeImpl *range)

{
  XMLSize_t XVar1;
  DOMRangeImpl *pDVar2;
  XMLSize_t getAt;
  
  if ((this->fRanges != (Ranges *)0x0) &&
     (XVar1 = (this->fRanges->super_BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>).fCurCount,
     XVar1 != 0)) {
    getAt = 0;
    do {
      pDVar2 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::elementAt
                         (&this->fRanges->super_BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>,getAt);
      if (pDVar2 == range) {
        (*(this->fRanges->super_BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>)._vptr_BaseRefVectorOf[4]
        )(this->fRanges,getAt);
        return;
      }
      getAt = getAt + 1;
    } while (XVar1 != getAt);
  }
  return;
}

Assistant:

void DOMDocumentImpl::removeRange(DOMRangeImpl* range)
{
    if (fRanges != 0) {
        XMLSize_t sz = fRanges->size();
        if (sz !=0) {
            for (XMLSize_t i =0; i<sz; i++) {
                if (fRanges->elementAt(i) == range) {
                    fRanges->removeElementAt(i);
                    break;
                }
            }
        }
    }
}